

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

int __thiscall sf::Image::copy(Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *in_RAX;
  int in_ECX;
  pointer __dest;
  int i;
  int iVar7;
  int *in_R8;
  void *pvVar8;
  char in_R9B;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  int iVar12;
  
  uVar2 = *(uint *)dst;
  if (uVar2 != 0) {
    iVar6 = *(int *)(dst + 4);
    in_RAX = (void *)CONCAT71((int7)((ulong)in_RAX >> 8),iVar6 == 0);
    uVar3 = (this->m_size).x;
    if ((uVar3 != 0 && iVar6 != 0) && (uVar9 = (this->m_size).y, uVar9 != 0)) {
      uVar4 = in_R8[2];
      iVar7 = in_R8[3];
      iVar12 = 0;
      if (iVar7 == 0 || uVar4 == 0) {
        iVar10 = 0;
        pvVar11 = (void *)(ulong)uVar2;
      }
      else {
        iVar12 = *in_R8;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        iVar10 = 0;
        if (0 < in_R8[1]) {
          iVar10 = in_R8[1];
        }
        if ((int)uVar2 <= (int)uVar4) {
          uVar4 = uVar2;
        }
        pvVar11 = (void *)(ulong)uVar4;
        if (iVar7 < iVar6) {
          iVar6 = iVar7;
        }
      }
      iVar7 = (int)src;
      in_RAX = (void *)(ulong)(uVar3 - iVar7);
      if ((uint)(iVar7 + (int)pvVar11) <= uVar3) {
        in_RAX = pvVar11;
      }
      iVar5 = uVar9 - in_ECX;
      if ((uint)(iVar6 + in_ECX) <= uVar9) {
        iVar5 = iVar6;
      }
      iVar6 = (int)in_RAX;
      if ((0 < iVar6) && (0 < iVar5)) {
        pvVar11 = (void *)((ulong)((iVar10 * uVar2 + iVar12) * 4) + *(long *)(dst + 8));
        __dest = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (in_ECX * uVar3 + iVar7) * 4;
        if (in_R9B == '\0') {
          iVar7 = 0;
          do {
            in_RAX = memcpy(__dest,pvVar11,(ulong)(uint)(iVar6 << 2));
            pvVar11 = (void *)((long)pvVar11 + (long)(int)(uVar2 << 2));
            __dest = __dest + (int)(uVar3 * 4);
            iVar7 = iVar7 + 1;
          } while (iVar7 < iVar5);
        }
        else {
          iVar7 = 0;
          do {
            if (0 < iVar6) {
              pvVar8 = (void *)0x0;
              do {
                bVar1 = *(byte *)((long)pvVar11 + (long)pvVar8 * 4 + 3);
                uVar9 = bVar1 ^ 0xff;
                __dest[(long)pvVar8 * 4] =
                     (uchar)((ulong)(__dest[(long)pvVar8 * 4] * uVar9 +
                                    (uint)*(byte *)((long)pvVar11 + (long)pvVar8 * 4) * (uint)bVar1)
                             * 0x1010102 >> 0x20);
                __dest[(long)pvVar8 * 4 + 1] =
                     (uchar)((ulong)(__dest[(long)pvVar8 * 4 + 1] * uVar9 +
                                    (uint)*(byte *)((long)pvVar11 + (long)pvVar8 * 4 + 1) *
                                    (uint)bVar1) * 0x1010102 >> 0x20);
                __dest[(long)pvVar8 * 4 + 2] =
                     (uchar)((ulong)(__dest[(long)pvVar8 * 4 + 2] * uVar9 +
                                    (uint)*(byte *)((long)pvVar11 + (long)pvVar8 * 4 + 2) *
                                    (uint)bVar1) * 0x1010102 >> 0x20);
                __dest[(long)pvVar8 * 4 + 3] =
                     (char)((ulong)(__dest[(long)pvVar8 * 4 + 3] * uVar9) * 0x1010102 >> 0x20) +
                     bVar1;
                pvVar8 = (void *)((long)pvVar8 + 1);
              } while (pvVar8 < in_RAX);
            }
            pvVar11 = (void *)((long)pvVar11 + (long)(int)(uVar2 << 2));
            __dest = __dest + (int)(uVar3 * 4);
            iVar7 = iVar7 + 1;
          } while (iVar7 < iVar5);
        }
      }
    }
  }
  return (int)in_RAX;
}

Assistant:

void Image::copy(const Image& source, unsigned int destX, unsigned int destY, const IntRect& sourceRect, bool applyAlpha)
{
    // Make sure that both images are valid
    if ((source.m_size.x == 0) || (source.m_size.y == 0) || (m_size.x == 0) || (m_size.y == 0))
        return;

    // Adjust the source rectangle
    IntRect srcRect = sourceRect;
    if (srcRect.width == 0 || (srcRect.height == 0))
    {
        srcRect.left   = 0;
        srcRect.top    = 0;
        srcRect.width  = source.m_size.x;
        srcRect.height = source.m_size.y;
    }
    else
    {
        if (srcRect.left   < 0) srcRect.left = 0;
        if (srcRect.top    < 0) srcRect.top  = 0;
        if (srcRect.width  > static_cast<int>(source.m_size.x)) srcRect.width  = source.m_size.x;
        if (srcRect.height > static_cast<int>(source.m_size.y)) srcRect.height = source.m_size.y;
    }

    // Then find the valid bounds of the destination rectangle
    int width  = srcRect.width;
    int height = srcRect.height;
    if (destX + width  > m_size.x) width  = m_size.x - destX;
    if (destY + height > m_size.y) height = m_size.y - destY;

    // Make sure the destination area is valid
    if ((width <= 0) || (height <= 0))
        return;

    // Precompute as much as possible
    int          pitch     = width * 4;
    int          rows      = height;
    int          srcStride = source.m_size.x * 4;
    int          dstStride = m_size.x * 4;
    const Uint8* srcPixels = &source.m_pixels[0] + (srcRect.left + srcRect.top * source.m_size.x) * 4;
    Uint8*       dstPixels = &m_pixels[0] + (destX + destY * m_size.x) * 4;

    // Copy the pixels
    if (applyAlpha)
    {
        // Interpolation using alpha values, pixel by pixel (slower)
        for (int i = 0; i < rows; ++i)
        {
            for (int j = 0; j < width; ++j)
            {
                // Get a direct pointer to the components of the current pixel
                const Uint8* src = srcPixels + j * 4;
                Uint8*       dst = dstPixels + j * 4;

                // Interpolate RGBA components using the alpha value of the source pixel
                Uint8 alpha = src[3];
                dst[0] = (src[0] * alpha + dst[0] * (255 - alpha)) / 255;
                dst[1] = (src[1] * alpha + dst[1] * (255 - alpha)) / 255;
                dst[2] = (src[2] * alpha + dst[2] * (255 - alpha)) / 255;
                dst[3] = alpha + dst[3] * (255 - alpha) / 255;
            }

            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
    else
    {
        // Optimized copy ignoring alpha values, row by row (faster)
        for (int i = 0; i < rows; ++i)
        {
            std::memcpy(dstPixels, srcPixels, pitch);
            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
}